

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O2

CEPlanet * CEPlanet::Uranus(void)

{
  CEPlanet *in_RDI;
  allocator local_69;
  CEAngle local_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Uranus",&local_69);
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&local_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&local_68,&local_44);
  CEAngle::~CEAngle(&local_68);
  CEAngle::~CEAngle(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_69);
  SetSemiMajorAxis_AU(in_RDI,19.18797948,-0.00020455);
  SetEccentricity(in_RDI,0.0468574,-1.55e-05);
  SetInclination(in_RDI,0.77298127,-0.00180155,DEGREES);
  SetMeanLongitude(in_RDI,314.20276625,428.49512595,DEGREES);
  SetPerihelionLongitude(in_RDI,172.43404441,0.09266985,DEGREES);
  SetAscendingNodeLongitude(in_RDI,73.96250215,0.05739699,DEGREES);
  SetExtraTerms(in_RDI,0.00058331,-0.97731848,0.17689245,7.67025);
  SetMeanRadius_m(in_RDI,25362000.0);
  SetAlbedo(in_RDI,0.51);
  SetMass_kg(in_RDI,8.68103e+25);
  local_40._M_dataplus._M_p = (pointer)0x401c000000000000;
  SetSofaID(in_RDI,(double *)&local_40);
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::Uranus()
{
    CEPlanet uranus("Uranus", 0.0, 0.0) ;
    uranus.SetSemiMajorAxis_AU(19.18797948, -0.00020455) ;
    uranus.SetEccentricity(0.04685740, -0.00001550) ;
    uranus.SetInclination(0.77298127, -0.00180155, CEAngleType::DEGREES) ;
    uranus.SetMeanLongitude(314.20276625, 428.49512595, CEAngleType::DEGREES) ;
    uranus.SetPerihelionLongitude(172.43404441, 0.09266985, CEAngleType::DEGREES) ;
    uranus.SetAscendingNodeLongitude(73.96250215, 0.05739699, CEAngleType::DEGREES) ;
    
    uranus.SetExtraTerms(0.00058331, -0.97731848, 0.17689245, 7.67025000) ;
    
    // Set planetary properties
    uranus.SetMeanRadius_m(25362000.0) ;
    uranus.SetAlbedo(0.51) ;
    uranus.SetMass_kg(8.68103E25) ;
    
    // Set the sofa planet ID
    uranus.SetSofaID(7) ;
    
    return uranus ;
}